

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

int update_path_and_do(c2m_ctx_t c2m_ctx,int go_inside_p,
                      _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *action,size_t mark,
                      node_t_conflict value,int const_only_p,mir_llong *max_index,pos_t pos,
                      char *detail)

{
  node_code_t nVar1;
  type_mode tVar2;
  byte *pbVar3;
  VARR_init_object_t *varr;
  init_object_t obj;
  int iVar4;
  size_t sVar5;
  node_t_conflict pnVar6;
  anon_union_8_2_e4b0c9a5_for_u aVar7;
  ulong uVar8;
  long lVar9;
  init_object_t *piVar10;
  anon_union_8_2_e4b0c9a5_for_u *paVar11;
  type *ptVar12;
  init_object_t local_88;
  int local_70;
  undefined4 local_6c;
  long local_68;
  int local_5c;
  node_t_conflict local_58;
  _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *local_50;
  init_object_t local_48;
  
  if (value->attr == (void *)0x0) {
    local_68 = 0;
  }
  else {
    local_68 = *(long *)((long)value->attr + 0x18);
  }
  local_70 = const_only_p;
  local_5c = go_inside_p;
  local_58 = value;
  local_50 = action;
  if (go_inside_p == 0) {
    local_6c = 0;
  }
  else {
    nVar1 = value->code;
    local_6c = CONCAT31((int3)(nVar1 >> 8),nVar1 != N_COMPOUND_LITERAL && nVar1 != N_LIST);
  }
LAB_0015a3f7:
  do {
    while( true ) {
      lVar9 = -1;
      sVar5 = VARR_init_object_tlength(c2m_ctx->init_object_path);
      if (sVar5 == mark) {
        error(c2m_ctx,0x18c4e4,pos.fname,pos._8_8_,detail);
        return 0;
      }
      VARR_init_object_tlast(&local_88,c2m_ctx->init_object_path);
      tVar2 = (local_88.container_type)->mode;
      if (1 < tVar2 - TM_STRUCT) break;
      if (local_88.u.curr_index == 0) {
        pnVar6 = DLIST_node_t_el(&((((local_88.container_type)->u).tag_type)->u).ops,1);
        if ((pnVar6 == (node_t_conflict)0x0) || (pnVar6->code != N_LIST)) {
          __assert_fail("declaration_list != NULL && declaration_list->code == N_LIST",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x1cc4,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)"
                       );
        }
        paVar11 = (anon_union_8_2_e4b0c9a5_for_u *)&pnVar6->u;
        while (aVar7 = (anon_union_8_2_e4b0c9a5_for_u)paVar11->curr_member,
              (node_t_conflict)aVar7.curr_index != (node_t_conflict)0x0) {
          if (((aVar7.curr_member)->code == N_MEMBER) &&
             ((pnVar6 = DLIST_node_t_el(&((aVar7.curr_member)->u).ops,1), pnVar6->code != N_IGNORE
              || (((aVar7.curr_member)->attr != (void *)0x0 &&
                  (*(char *)(*(long *)((long)(aVar7.curr_member)->attr + 0x40) + 0x1d) != '\0'))))))
          goto LAB_0015a54f;
          paVar11 = (anon_union_8_2_e4b0c9a5_for_u *)&((aVar7.curr_member)->op_link).next;
        }
      }
      else if (((tVar2 != TM_UNION) || (local_88.field_designator_p != 0)) &&
              (aVar7.curr_member = get_adjacent_member(local_88.u.curr_member,1),
              aVar7.curr_index != 0)) {
LAB_0015a54f:
        local_88._8_8_ = local_88._8_8_ & 0xffffffff00000000;
        ptVar12 = *(type **)((long)(aVar7.curr_member)->attr + 0x40);
        local_88.u = aVar7;
        goto LAB_0015a55c;
      }
      local_88.u.curr_index = 0;
      VARR_init_object_tpop(&local_48,c2m_ctx->init_object_path);
    }
    if (tVar2 != TM_ARR) {
      __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1cc0,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)");
    }
    ptVar12 = (((local_88.container_type)->u).arr_type)->el_type;
    pnVar6 = (((local_88.container_type)->u).arr_type)->size;
    if (((pnVar6->code != N_IGNORE) && (pbVar3 = (byte *)pnVar6->attr, (*pbVar3 & 1) != 0)) &&
       (iVar4 = integer_type_p(*(type **)(pbVar3 + 0x18)), iVar4 != 0)) {
      lVar9 = *(long *)(pbVar3 + 0x30);
    }
    local_88.u.curr_member = (node_t_conflict)((long)&(local_88.u.curr_member)->code + 1);
    if (local_88.u.curr_index < lVar9 || lVar9 < 0) {
LAB_0015a55c:
      varr = c2m_ctx->init_object_path;
      sVar5 = VARR_init_object_tlength(varr);
      if (((varr == (VARR_init_object_t *)0x0) ||
          (piVar10 = varr->varr, piVar10 == (init_object_t *)0x0)) ||
         (uVar8 = sVar5 - 1, varr->els_num <= uVar8)) {
        mir_varr_assert_fail("set","init_object_t");
      }
      piVar10[uVar8].u.curr_member = (node_t_conflict)local_88.u;
      piVar10 = piVar10 + uVar8;
      piVar10->container_type = local_88.container_type;
      piVar10->field_designator_p = local_88.field_designator_p;
      *(undefined4 *)&piVar10->field_0xc = local_88._12_4_;
      aVar7.curr_index = -1;
      if (((char)local_6c == '\0') || (iVar4 = scalar_type_p(ptVar12), iVar4 != 0)) {
LAB_0015a69b:
        if (local_5c == 0) {
          return 1;
        }
        VARR_init_object_tlast(&local_88,c2m_ctx->init_object_path);
        pnVar6 = local_58;
        if ((local_88.container_type)->mode - TM_STRUCT < 2) {
          (*local_50)(c2m_ctx,(decl_t)(local_88.u.curr_member)->attr,
                      &(((decl_t)(local_88.u.curr_member)->attr)->decl_spec).type,local_58,local_70,
                      0);
        }
        else if ((local_88.container_type)->mode == TM_ARR) {
          ptVar12 = ((local_88.container_type)->u).ptr_type;
          iVar4 = init_compatible_string_p(local_58,ptVar12->arr_type);
          piVar10 = &local_88;
          if (iVar4 == 0) {
            piVar10 = (init_object_t *)&ptVar12->arr_type;
          }
          (*local_50)(c2m_ctx,(decl_t)0x0,&piVar10->container_type,pnVar6,local_70,0);
        }
        if (max_index == (mir_llong *)0x0) {
          return 1;
        }
        VARR_init_object_tget(&local_48,c2m_ctx->init_object_path,mark);
        if ((local_48.container_type)->mode != TM_ARR) {
          return 1;
        }
        if (*max_index < local_48.u.curr_index) {
          *max_index = (mir_llong)local_48.u;
          return 1;
        }
        return 1;
      }
      tVar2 = ptVar12->mode;
      if (tVar2 == TM_BASIC) {
        if ((ptVar12->u).basic_type != TP_VOID) goto LAB_0015a7cc;
        goto LAB_0015a69b;
      }
      if (2 < tVar2 - TM_STRUCT) {
LAB_0015a7cc:
        __assert_fail("el_type->mode == TM_ARR || el_type->mode == TM_STRUCT || el_type->mode == TM_UNION"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1cdd,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)");
      }
      if ((local_68 == 0) || (tVar2 == TM_ARR)) {
        local_88._8_8_ = (ulong)(uint)local_88._12_4_ << 0x20;
        if (tVar2 != TM_ARR) goto LAB_0015a61e;
      }
      else {
        if ((ptVar12->u).tag_type == *(node_t_conflict *)(local_68 + 0x30)) goto LAB_0015a69b;
        local_88._8_8_ = (ulong)(uint)local_88._12_4_ << 0x20;
LAB_0015a61e:
        aVar7.curr_index = 0;
      }
      obj.field_designator_p = local_88.field_designator_p;
      obj._12_4_ = local_88._12_4_;
      obj.container_type = ptVar12;
      obj.u.curr_index = aVar7.curr_index;
      local_88.container_type = ptVar12;
      local_88.u = aVar7;
      VARR_init_object_tpush(c2m_ctx->init_object_path,obj);
      goto LAB_0015a3f7;
    }
    VARR_init_object_tpop(&local_48,c2m_ctx->init_object_path);
  } while( true );
}

Assistant:

static int update_path_and_do (c2m_ctx_t c2m_ctx, int go_inside_p,
                               void (*action) (c2m_ctx_t c2m_ctx, decl_t member_decl,
                                               struct type **type_ptr, node_t initializer,
                                               int const_only_p, int top_p),
                               size_t mark, node_t value, int const_only_p, mir_llong *max_index,
                               pos_t pos, const char *detail) {
  init_object_t init_object;
  mir_llong index;
  struct type *el_type;
  struct expr *value_expr = value->attr;

  if (!update_init_object_path (c2m_ctx, mark, value_expr == NULL ? NULL : value_expr->type,
                                !go_inside_p || value->code == N_LIST
                                  || value->code == N_COMPOUND_LITERAL)) {
    error (c2m_ctx, pos, "excess elements in %s initializer", detail);
    return FALSE;
  }
  if (!go_inside_p) return TRUE;
  init_object = VARR_LAST (init_object_t, init_object_path);
  if (init_object.container_type->mode == TM_ARR) {
    el_type = init_object.container_type->u.arr_type->el_type;
    action (c2m_ctx, NULL,
            (init_compatible_string_p (value, el_type)
               ? &init_object.container_type
               : &init_object.container_type->u.arr_type->el_type),
            value, const_only_p, FALSE);
  } else if (init_object.container_type->mode == TM_STRUCT
             || init_object.container_type->mode == TM_UNION) {
    action (c2m_ctx, (decl_t) init_object.u.curr_member->attr,
            &((decl_t) init_object.u.curr_member->attr)->decl_spec.type, value, const_only_p,
            FALSE);
  }
  if (max_index != NULL) {
    init_object = VARR_GET (init_object_t, init_object_path, mark);
    if (init_object.container_type->mode == TM_ARR
        && *max_index < (index = init_object.u.curr_index))
      *max_index = index;
  }
  return TRUE;
}